

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O1

void __thiscall
MaterialSystemTest_testStringProperty_Test::TestBody
          (MaterialSystemTest_testStringProperty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  aiString s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  AssertHelper local_448;
  internal local_440 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  aiString local_42c;
  
  local_42c.length = 0;
  local_42c.data._0_4_ = local_42c.data._0_4_ & 0xffffff00;
  memset(local_42c.data + 1,0x1b,0x3ff);
  local_42c.length = 0x1b;
  builtin_strncpy(local_42c.data,"Hello, this is a small test",0x1c);
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,&local_42c,"testKey6",0,0);
  local_42c.length = 6;
  builtin_strncpy(local_42c.data,"358358",7);
  local_450.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_450.ptr_._4_4_ << 0x20);
  local_448.data_._0_4_ =
       aiGetMaterialString((this->super_MaterialSystemTest).pcMat,"testKey6",0,0,&local_42c);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            (local_440,"aiReturn_SUCCESS","pcMat->Get(\"testKey6\",0,0,s)",(aiReturn *)&local_450,
             (aiReturn *)&local_448);
  if (local_440[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_450);
    if (local_438.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_438.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    if (local_450.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_450.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_450.ptr_ + 8))();
      }
      local_450.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_438,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            (local_440,"\"Hello, this is a small test\"","s.data","Hello, this is a small test",
             local_42c.data);
  if (local_440[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_450);
    if (local_438.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_438.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_448,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    if (local_450.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_450.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_450.ptr_ + 8))();
      }
      local_450.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_438,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testStringProperty) {
    aiString s;
    s.Set("Hello, this is a small test");
    this->pcMat->AddProperty(&s,"testKey6");
    s.Set("358358");
    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey6",0,0,s));
    EXPECT_STREQ("Hello, this is a small test", s.data);
}